

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
         *this,size_t new_capacity)

{
  LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<char,_char>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
  *this_00;
  slot_type *m;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *prVar1;
  bool bVar2;
  size_t hashval_00;
  size_t in_RSI;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_RDI;
  FindInfo FVar3;
  LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<char,_char>_> LVar4;
  Layout layout;
  size_t new_i;
  FindInfo target;
  size_t hashval;
  size_t i;
  size_t old_capacity;
  slot_type *old_slots;
  ctrl_t *old_ctrl;
  slot_type *in_stack_ffffffffffffff78;
  allocator<std::pair<const_char,_char>_> *in_stack_ffffffffffffff80;
  size_t i_00;
  size_t in_stack_ffffffffffffffa8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_stack_ffffffffffffffb0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *this_01;
  
  bVar2 = IsValidCapacity(in_RSI);
  if (bVar2) {
    this_00 = (LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<char,_char>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
               *)in_RDI->ctrl_;
    m = in_RDI->slots_;
    prVar1 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
              *)in_RDI->capacity_;
    initialize_slots(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_RDI->capacity_ = in_RSI;
    for (this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                    *)0x0; this_01 != prVar1;
        this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *)((long)&this_01->ctrl_ + 1)) {
      bVar2 = IsFull(*(ctrl_t *)((long)&this_01->ctrl_ + (long)this_00->size_));
      if (bVar2) {
        hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                  *)0x160a58);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<char,char>,void>::
        element<phmap::priv::FlatHashMapPolicy<char,char>>((slot_type *)0x160a72);
        hashval_00 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<char,char>,void>::
                     apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>::HashElement,std::pair<char_const,char>&,phmap::priv::FlatHashMapPolicy<char,char>>
                               ((HashElement *)in_stack_ffffffffffffff80,
                                &in_stack_ffffffffffffff78->value);
        FVar3 = find_first_non_full(this_01,hashval_00);
        i_00 = FVar3.offset;
        H2(hashval_00);
        set_ctrl(in_RDI,i_00,(ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
        alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *)0x160ad7);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<char,char>,void>::
        transfer<std::allocator<std::pair<char_const,char>>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(slot_type *)0x160b03);
      }
    }
    if (prVar1 != (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *)0x0) {
      SanitizerUnpoisonMemoryRegion(m,(long)prVar1 << 1);
      LVar4.size_ = (size_t  [2])MakeLayout(0x160b3c);
      alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                 *)0x160b50);
      internal_layout::
      LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<char,_char>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
      ::AllocSize(this_00);
      Deallocate<1ul,std::allocator<std::pair<char_const,char>>>
                (LVar4.size_[1],LVar4.size_[0],(size_t)in_RDI);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char, char>, phmap::Hash<char>, phmap::EqualTo<char>, std::allocator<std::pair<const char, char>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<char, char>, Hash = phmap::Hash<char>, Eq = phmap::EqualTo<char>, Alloc = std::allocator<std::pair<const char, char>>]"
               );
}

Assistant:

void resize(size_t new_capacity)
			{
				assert(IsValidCapacity(new_capacity));
				auto* old_ctrl = ctrl_;
				auto* old_slots = slots_;
				const size_t old_capacity = capacity_;
				initialize_slots(new_capacity);
				capacity_ = new_capacity;

				for (size_t i = 0; i != old_capacity; ++i) {
					if (IsFull(old_ctrl[i])) {
						size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
						                                     PolicyTraits::element(old_slots + i));
						auto target = find_first_non_full(hashval);
						size_t new_i = target.offset;
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, old_slots + i);
					}
				}
				if (old_capacity) {
					SanitizerUnpoisonMemoryRegion(old_slots,
					                              sizeof(slot_type) * old_capacity);
					auto layout = MakeLayout(old_capacity);
					Deallocate<Layout::Alignment()>(&alloc_ref(), old_ctrl,
					                                layout.AllocSize());
				}
			}